

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch_test.cc
# Opt level: O3

void __thiscall leveldb::_Test_Corruption::_Run(_Test_Corruption *this)

{
  WriteBatch *b;
  WriteBatch batch;
  WriteBatch local_1e8;
  string local_1c8;
  Tester local_1a8;
  
  WriteBatch::WriteBatch(&local_1e8);
  local_1a8._0_8_ = "foo";
  local_1a8.fname_ = (char *)0x3;
  local_1c8._M_dataplus._M_p = "bar";
  local_1c8._M_string_length = 3;
  WriteBatch::Put(&local_1e8,(Slice *)&local_1a8,(Slice *)&local_1c8);
  local_1a8._0_8_ = "box";
  local_1a8.fname_ = (char *)0x3;
  WriteBatch::Delete(&local_1e8,(Slice *)&local_1a8);
  WriteBatchInternal::SetSequence(&local_1e8,200);
  local_1a8.fname_ = (char *)(local_1e8.rep_._M_string_length - 1);
  local_1a8._0_8_ = local_1e8.rep_._M_dataplus._M_p;
  WriteBatchInternal::SetContents(&local_1e8,(Slice *)&local_1a8);
  local_1a8.ok_ = true;
  local_1a8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
  ;
  local_1a8.line_ = 0x59;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1a8 + 0x18));
  PrintContents_abi_cxx11_(&local_1c8,(leveldb *)&local_1e8,b);
  test::Tester::IsEq<char[30],std::__cxx11::string>
            (&local_1a8,(char (*) [30])"Put(foo, bar)@200ParseError()",&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1a8);
  WriteBatch::~WriteBatch(&local_1e8);
  return;
}

Assistant:

TEST(WriteBatchTest, Corruption) {
  WriteBatch batch;
  batch.Put(Slice("foo"), Slice("bar"));
  batch.Delete(Slice("box"));
  WriteBatchInternal::SetSequence(&batch, 200);
  Slice contents = WriteBatchInternal::Contents(&batch);
  WriteBatchInternal::SetContents(&batch,
                                  Slice(contents.data(), contents.size() - 1));
  ASSERT_EQ(
      "Put(foo, bar)@200"
      "ParseError()",
      PrintContents(&batch));
}